

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

void __thiscall
OpenMD::HydroProp::pitchAxes
          (HydroProp *this,Mat3x3d *pitchAxes,Vector3d *pitches,RealType *pitchScalar)

{
  double *in_RCX;
  Vector<double,_3U> *in_RDX;
  double dVar1;
  int i;
  Mat3x3d P;
  HydroProp *in_stack_00000148;
  SquareMatrix3<double> *in_stack_00000260;
  Vector3<double> *in_stack_00000268;
  SquareMatrix3<double> *in_stack_00000270;
  int in_stack_ffffffffffffff6c;
  __type in_stack_ffffffffffffff70;
  undefined4 local_78;
  
  getPitchMatrix(in_stack_00000148);
  SquareMatrix3<double>::diagonalize(in_stack_00000270,in_stack_00000268,in_stack_00000260);
  *in_RCX = 0.0;
  for (local_78 = 0; (int)local_78 < 3; local_78 = local_78 + 1) {
    Vector<double,_3U>::operator[](in_RDX,local_78);
    in_stack_ffffffffffffff70 =
         std::pow<double,int>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    *in_RCX = in_stack_ffffffffffffff70 + *in_RCX;
  }
  *in_RCX = *in_RCX / 3.0;
  dVar1 = sqrt(*in_RCX);
  *in_RCX = dVar1;
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3baf19);
  return;
}

Assistant:

void HydroProp::pitchAxes(Mat3x3d& pitchAxes, Vector3d& pitches,
                            RealType& pitchScalar) {
    Mat3x3d P = getPitchMatrix();

    Mat3x3d::diagonalize(P, pitches, pitchAxes);

    pitchScalar = 0.0;
    for (int i = 0; i < 3; i++) {
      pitchScalar += pow(pitches[i], 2);
    }
    pitchScalar /= 3.0;

    pitchScalar = sqrt(pitchScalar);
  }